

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QColorListModel.cpp
# Opt level: O1

QVariant * __thiscall
QColorListModel::data
          (QVariant *__return_storage_ptr__,QColorListModel *this,QModelIndex *index,int role)

{
  ulong uVar1;
  undefined8 extraout_RAX;
  ulong uVar2;
  undefined1 auStack_48 [16];
  QArrayDataPointer<char16_t> local_38;
  QSize local_20;
  
  uVar2 = (ulong)index->r;
  if ((long)uVar2 < 0) {
LAB_0017832b:
    (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
    *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
    *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
    return __return_storage_ptr__;
  }
  uVar1 = (this->d->colors).d.size;
  if ((long)uVar1 <= (long)uVar2) goto LAB_0017832b;
  if (role == 1) {
    if (uVar2 < uVar1) {
      QColor::setNamedColor((QString *)(auStack_48 + 0x10));
      local_20.wd = 0x40;
      local_20.ht = 0x40;
      QtWidgetsExtraCache::cachedIconColor
                ((QtWidgetsExtraCache *)auStack_48,(QColor *)(auStack_48 + 0x10),&local_20);
      QIcon::operator_cast_to_QVariant(__return_storage_ptr__,(QIcon *)auStack_48);
      QIcon::~QIcon((QIcon *)auStack_48);
      return __return_storage_ptr__;
    }
    data();
  }
  else {
    if ((role & 0xfffffffdU) != 0) {
      if (role != 0x100) goto LAB_0017832b;
      if (uVar2 < uVar1) {
        QVariant::QVariant(__return_storage_ptr__,(this->d->colors).d.ptr + uVar2);
        return __return_storage_ptr__;
      }
      goto LAB_001783a2;
    }
    if (uVar2 < uVar1) {
      QColor::setNamedColor((QString *)auStack_48);
      QColor::name((NameFormat)(QString *)(auStack_48 + 0x10));
      QVariant::QVariant(__return_storage_ptr__,(QString *)(auStack_48 + 0x10));
      QArrayDataPointer<char16_t>::~QArrayDataPointer
                ((QArrayDataPointer<char16_t> *)(auStack_48 + 0x10));
      return __return_storage_ptr__;
    }
  }
  data();
LAB_001783a2:
  data();
  QArrayDataPointer<char16_t>::~QArrayDataPointer
            ((QArrayDataPointer<char16_t> *)(auStack_48 + 0x10));
  _Unwind_Resume(extraout_RAX);
}

Assistant:

QVariant QColorListModel::data(const QModelIndex &index, int role) const {
    if (index.row() < 0 || index.row() >= d->colors.size()) {
        return QVariant();
    }

    if (role == Qt::DecorationRole) {
        return QtWidgetsExtraCache::cachedIconColor(QColor(d->colors.at(index.row())), QSize(64, 64));
    } else if (role == Qt::DisplayRole || role == Qt::EditRole) {
        return QColor(d->colors.at(index.row())).name(QColor::NameFormat(d->nameFormat));
    } else if (role == static_cast<int>(QColorListModel::Role::HexArgbName)) {
        return d->colors.at(index.row());
    }

    return QVariant();
}